

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_verify_vector.cpp
# Opt level: O1

OperatorResultType
duckdb::VerifyEmitNestedShuffleVector(DataChunk *input,DataChunk *chunk,OperatorState *state)

{
  reference vector;
  size_type __n;
  
  DataChunk::Copy(input,chunk,0);
  if ((chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      vector = vector<duckdb::Vector,_true>::operator[](&chunk->data,__n);
      Vector::DebugShuffleNestedVector(vector,chunk->count);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType VerifyEmitNestedShuffleVector(const DataChunk &input, DataChunk &chunk, OperatorState &state) {
	input.Copy(chunk);
	for (idx_t c = 0; c < chunk.ColumnCount(); c++) {
		Vector::DebugShuffleNestedVector(chunk.data[c], chunk.size());
	}
	return OperatorResultType::NEED_MORE_INPUT;
}